

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapping.cpp
# Opt level: O1

void matrixFromStdVector(void)

{
  ostream *poVar1;
  initializer_list<float> __l;
  vector<float,_std::allocator<float>_> data;
  Map<Eigen::Matrix<float,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> einMatRowMajor;
  Map<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> einMatColMajor;
  vector<float,_std::allocator<float>_> local_60;
  pointer local_48 [2];
  pointer local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_18;
  
  local_28 = 0x40c0000040a00000;
  uStack_20 = 0x4100000040e00000;
  local_38 = (pointer)0x400000003f800000;
  uStack_30 = 0x4080000040400000;
  local_18 = 0x41100000;
  __l._M_len = 9;
  __l._M_array = (iterator)&local_38;
  std::vector<float,_std::allocator<float>_>::vector(&local_60,__l,(allocator_type *)local_48);
  local_38 = local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Map<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                              *)&local_38);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_48[0] = local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Map<Eigen::Matrix<float,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                              *)local_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void matrixFromStdVector() {
  std::vector<float> data = {1, 2, 3, 4, 5, 6, 7, 8, 9};

  auto einMatColMajor = Eigen::Map<Eigen::Matrix<float, 3, 3>>(data.data());

  data.clear();
  std::cout << einMatColMajor << std::endl;

  auto einMatRowMajor =
      Eigen::Map<Eigen::Matrix<float, 3, 3, Eigen::RowMajor>>(data.data());

  std::cout << einMatRowMajor << std::endl;
}